

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

FeatureSet * __thiscall
google::protobuf::DescriptorPool::Tables::InternFeatureSet(Tables *this,FeatureSet *features)

{
  FeatureSet *pFVar1;
  __uniq_ptr_impl<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>
  *this_00;
  pointer __p;
  string local_50;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>_>_>_>::iterator,_bool>
  local_30;
  
  MessageLite::SerializeAsString_abi_cxx11_(&local_50,(MessageLite *)features);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::unique_ptr<google::protobuf::FeatureSet,std::default_delete<google::protobuf::FeatureSet>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<google::protobuf::FeatureSet,std::default_delete<google::protobuf::FeatureSet>>>>>
  ::try_emplace_impl<std::__cxx11::string>(&local_30,&this->feature_set_cache_,&local_50);
  this_00 = (__uniq_ptr_impl<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>
             *)((long)local_30.first.field_1.slot_ + 0x20);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  pFVar1 = (this_00->_M_t).
           super__Tuple_impl<0UL,_google::protobuf::FeatureSet_*,_std::default_delete<google::protobuf::FeatureSet>_>
           .super__Head_base<0UL,_google::protobuf::FeatureSet_*,_false>._M_head_impl;
  if (pFVar1 == (FeatureSet *)0x0) {
    pFVar1 = (FeatureSet *)operator_new(0x50);
    FeatureSet::FeatureSet(pFVar1,(Arena *)0x0,features);
    local_50._M_dataplus._M_p = (pointer)0x0;
    std::
    __uniq_ptr_impl<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>
    ::reset(this_00,pFVar1);
    std::
    unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>::
    ~unique_ptr((unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>
                 *)&local_50);
    pFVar1 = (this_00->_M_t).
             super__Tuple_impl<0UL,_google::protobuf::FeatureSet_*,_std::default_delete<google::protobuf::FeatureSet>_>
             .super__Head_base<0UL,_google::protobuf::FeatureSet_*,_false>._M_head_impl;
  }
  return pFVar1;
}

Assistant:

const FeatureSet* DescriptorPool::Tables::InternFeatureSet(
    FeatureSet&& features) {
  // Use the serialized feature set as the cache key.  If multiple equivalent
  // feature sets serialize to different strings, that just bloats the cache a
  // little.
  auto& result = feature_set_cache_[features.SerializeAsString()];
  if (result == nullptr) {
    result = absl::make_unique<FeatureSet>(std::move(features));
  }
  return result.get();
}